

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O0

bool __thiscall
rsg::VariableManager::canDeclareInCurrentScope(VariableManager *this,Variable *variable)

{
  bool bVar1;
  VariableScope *this_00;
  __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_40;
  Variable **local_38;
  __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_30;
  __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_28;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *local_20;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *curLiveVars;
  Variable *variable_local;
  VariableManager *this_local;
  
  curLiveVars = (vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)variable;
  variable_local = (Variable *)this;
  this_00 = getCurVariableScope(this);
  local_20 = VariableScope::getLiveVariables(this_00);
  local_30._M_current =
       (Variable **)std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::begin(local_20);
  local_38 = (Variable **)
             std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::end(local_20);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<rsg::Variable*const*,std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>>,rsg::Variable_const*>
                       (local_30,(__normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
                                  )local_38,(Variable **)&curLiveVars);
  local_40._M_current =
       (Variable **)std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::end(local_20);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_40);
  return bVar1;
}

Assistant:

bool VariableManager::canDeclareInCurrentScope (const Variable* variable) const
{
	const vector<Variable*>& curLiveVars = getCurVariableScope().getLiveVariables();
	return std::find(curLiveVars.begin(), curLiveVars.end(), variable) != curLiveVars.end();
}